

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner::makeReporter(Runner *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  Config *p;
  IStreamingReporter *p_00;
  ostream *poVar5;
  domain_error *this_00;
  string local_208 [32];
  ostringstream local_1e8 [8];
  ostringstream oss;
  Ptr<Catch::IConfig> local_70 [3];
  byte local_52;
  allocator local_51;
  undefined1 local_50 [32];
  undefined1 local_30 [8];
  string reporterName;
  Runner *this_local;
  
  Ptr<Catch::Config>::operator->(&this->m_config);
  Config::getReporterName_abi_cxx11_((Config *)local_50);
  uVar3 = std::__cxx11::string::empty();
  local_52 = 0;
  if ((uVar3 & 1) == 0) {
    Ptr<Catch::Config>::operator->(&this->m_config);
    Config::getReporterName_abi_cxx11_((Config *)local_30);
  }
  else {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string((string *)local_30,"console",&local_51);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  std::__cxx11::string::~string((string *)local_50);
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[2])();
  p = Ptr<Catch::Config>::get(&this->m_config);
  Ptr<Catch::IConfig>::Ptr(local_70,(IConfig *)p);
  p_00 = (IStreamingReporter *)
         (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                   ((long *)CONCAT44(extraout_var,iVar2),local_30,local_70);
  Ptr<Catch::IStreamingReporter>::operator=(&this->m_reporter,p_00);
  Ptr<Catch::IConfig>::~Ptr(local_70);
  bVar1 = Ptr<Catch::IStreamingReporter>::operator!(&this->m_reporter);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    poVar5 = std::operator<<((ostream *)local_1e8,"No reporter registered with name: \'");
    poVar5 = std::operator<<(poVar5,(string *)local_30);
    std::operator<<(poVar5,"\'");
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::domain_error::domain_error(this_00,local_208);
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void makeReporter() {
            std::string reporterName = m_config->getReporterName().empty()
                ? "console"
                : m_config->getReporterName();

            m_reporter = getRegistryHub().getReporterRegistry().create( reporterName, m_config.get() );
            if( !m_reporter ) {
                std::ostringstream oss;
                oss << "No reporter registered with name: '" << reporterName << "'";
                throw std::domain_error( oss.str() );
            }
        }